

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Scroll.cxx
# Opt level: O0

void __thiscall Fl_Scroll::resize(Fl_Scroll *this,int X,int Y,int W,int H)

{
  Fl_Widget *this_00;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  Fl_Align FVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  int local_b8;
  int local_ac;
  int local_98;
  int local_8c;
  char at;
  char al;
  char pad;
  Fl_Widget *o;
  Fl_Widget **ppFStack_38;
  int i;
  Fl_Widget **a;
  int dh;
  int dw;
  int dy;
  int dx;
  int H_local;
  int W_local;
  int Y_local;
  int X_local;
  Fl_Scroll *this_local;
  
  iVar1 = Fl_Widget::x((Fl_Widget *)this);
  iVar2 = Fl_Widget::y((Fl_Widget *)this);
  iVar3 = Fl_Widget::w((Fl_Widget *)this);
  iVar4 = Fl_Widget::h((Fl_Widget *)this);
  Fl_Widget::resize((Fl_Widget *)this,X,Y,W,H);
  fix_scrollbar_order(this);
  ppFStack_38 = Fl_Group::array(&this->super_Fl_Group);
  iVar5 = Fl_Group::children(&this->super_Fl_Group);
  o._4_4_ = iVar5 + -2;
  while (o._4_4_ != 0) {
    this_00 = *ppFStack_38;
    iVar5 = Fl_Widget::x(this_00);
    iVar6 = Fl_Widget::y(this_00);
    Fl_Widget::position(this_00,iVar5 + (X - iVar1),iVar6 + (Y - iVar2));
    o._4_4_ = o._4_4_ + -1;
    ppFStack_38 = ppFStack_38 + 1;
  }
  if ((W == iVar3) && (H == iVar4)) {
    uVar7 = Fl_Widget::visible((Fl_Widget *)&this->scrollbar);
    bVar9 = false;
    if (uVar7 != 0) {
      uVar7 = Fl_Widget::visible((Fl_Widget *)&this->hscrollbar);
      bVar9 = uVar7 != 0;
    }
    FVar8 = Fl_Widget::align((Fl_Widget *)&this->scrollbar);
    bVar10 = (FVar8 & 4) == 0;
    FVar8 = Fl_Widget::align((Fl_Widget *)&this->scrollbar);
    bVar11 = (FVar8 & 1) == 0;
    local_8c = X;
    if (bVar10) {
      local_8c = Fl_Widget::w((Fl_Widget *)&this->scrollbar);
      local_8c = (X + W) - local_8c;
    }
    local_98 = Y;
    if ((!bVar11) && (bVar9)) {
      local_98 = Fl_Widget::h((Fl_Widget *)&this->hscrollbar);
      local_98 = Y + local_98;
    }
    Fl_Widget::position((Fl_Widget *)&this->scrollbar,local_8c,local_98);
    local_ac = X;
    if ((!bVar10) && (bVar9)) {
      local_ac = Fl_Widget::w((Fl_Widget *)&this->scrollbar);
      local_ac = X + local_ac;
    }
    local_b8 = Y;
    if (bVar11) {
      local_b8 = Fl_Widget::h((Fl_Widget *)&this->hscrollbar);
      local_b8 = (Y + H) - local_b8;
    }
    Fl_Widget::position((Fl_Widget *)&this->hscrollbar,local_ac,local_b8);
  }
  else {
    Fl_Widget::redraw((Fl_Widget *)this);
  }
  return;
}

Assistant:

void Fl_Scroll::resize(int X, int Y, int W, int H) {
  int dx = X-x(), dy = Y-y();
  int dw = W-w(), dh = H-h();
  Fl_Widget::resize(X,Y,W,H); // resize _before_ moving children around
  fix_scrollbar_order();
  // move all the children:
  Fl_Widget*const* a = array();
  for (int i=children()-2; i--;) {
    Fl_Widget* o = *a++;
    o->position(o->x()+dx, o->y()+dy);
  }
  if (dw==0 && dh==0) {
    char pad = ( scrollbar.visible() && hscrollbar.visible() );
    char al = ( (scrollbar.align() & FL_ALIGN_LEFT) != 0 );
    char at = ( (scrollbar.align() & FL_ALIGN_TOP)  !=0 );
    scrollbar.position(al?X:X+W-scrollbar.w(), (at&&pad)?Y+hscrollbar.h():Y);
    hscrollbar.position((al&&pad)?X+scrollbar.w():X, at?Y:Y+H-hscrollbar.h());
  } else {
    // FIXME recalculation of scrollbars needs to be moved out of "draw()" (STR #1895)
    redraw(); // need full recalculation of scrollbars
  }
}